

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O1

void __thiscall
VulkanHppGenerator::checkRequireDependenciesCorrectness
          (VulkanHppGenerator *this,RequireData *require,string *section,string *name)

{
  pointer pcVar1;
  _Base_ptr p_Var2;
  _Base_ptr __n;
  _Alloc_hider __s2;
  VulkanHppGenerator *this_00;
  bool bVar3;
  bool condition;
  int iVar4;
  size_type sVar5;
  const_iterator cVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  pointer this_01;
  _Base_ptr p_Var10;
  string structure;
  string member;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dependencies;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string local_158;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  VulkanHppGenerator *local_b8;
  string *local_b0;
  string *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  _Base_ptr local_60;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>_>
  *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  local_b0 = name;
  local_a8 = section;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,",+()","");
  anon_unknown.dwarf_1900a8::tokenizeAny(&local_48,&require->depends,&local_138);
  local_b8 = this;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  local_50 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_58 = &local_b8->m_structs;
    local_60 = &(local_b8->m_structs)._M_t._M_impl.super__Rb_tree_header._M_header;
    this_01 = local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        (this_01,"::",0,2);
      this_00 = local_b8;
      if (sVar5 == 0xffffffffffffffff) {
        bVar3 = isSupportedFeature(local_b8,this_01);
        condition = true;
        if (((!bVar3) && (bVar3 = isUnsupportedFeature(this_00,this_01), !bVar3)) &&
           (bVar3 = isSupportedExtension(this_00,this_01), !bVar3)) {
          condition = isUnsupportedExtension(local_b8,this_01);
        }
        iVar4 = require->xmlLine;
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        pcVar1 = (local_a8->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_198,pcVar1,pcVar1 + local_a8->_M_string_length);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_198," <");
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_198,(local_b0->_M_dataplus)._M_p,local_b0->_M_string_length);
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar7->_M_dataplus)._M_p;
        paVar8 = &pbVar7->field_2;
        if (paVar9 == paVar8) {
          local_178.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_178.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
        }
        else {
          local_178.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_178._M_dataplus._M_p = (pointer)paVar9;
        }
        local_178._M_string_length = pbVar7->_M_string_length;
        (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
        pbVar7->_M_string_length = 0;
        (pbVar7->field_2)._M_local_buf[0] = '\0';
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_178,"> depends on unknown extension or feature <");
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar7->_M_dataplus)._M_p;
        paVar8 = &pbVar7->field_2;
        if (paVar9 == paVar8) {
          local_158.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_158.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
        }
        else {
          local_158.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_158._M_dataplus._M_p = (pointer)paVar9;
        }
        local_158._M_string_length = pbVar7->_M_string_length;
        (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
        pbVar7->_M_string_length = 0;
        (pbVar7->field_2)._M_local_buf[0] = '\0';
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_158,(this_01->_M_dataplus)._M_p,this_01->_M_string_length);
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar7->_M_dataplus)._M_p;
        paVar8 = &pbVar7->field_2;
        if (paVar9 == paVar8) {
          local_d8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
        }
        else {
          local_d8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_d8._M_dataplus._M_p = (pointer)paVar9;
        }
        local_d8._M_string_length = pbVar7->_M_string_length;
        (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
        pbVar7->_M_string_length = 0;
        (pbVar7->field_2)._M_local_buf[0] = '\0';
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_d8,">");
        local_138._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
        paVar9 = &pbVar7->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p == paVar9) {
          local_138.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_138.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        }
        else {
          local_138.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        }
        local_138._M_string_length = pbVar7->_M_string_length;
        (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar7->_M_string_length = 0;
        (pbVar7->field_2)._M_local_buf[0] = '\0';
        checkForError(condition,iVar4,&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_138,this_01,0,sVar5);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_d8,this_01,sVar5 + 2,0xffffffffffffffff);
        cVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>_>
                ::find(&local_58->_M_t,&local_138);
        iVar4 = require->xmlLine;
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        pcVar1 = (local_a8->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_118,pcVar1,pcVar1 + local_a8->_M_string_length);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_118," <");
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_118,(local_b0->_M_dataplus)._M_p,local_b0->_M_string_length);
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar7->_M_dataplus)._M_p;
        paVar8 = &pbVar7->field_2;
        if (paVar9 == paVar8) {
          local_f8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
        }
        else {
          local_f8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_f8._M_dataplus._M_p = (pointer)paVar9;
        }
        local_f8._M_string_length = pbVar7->_M_string_length;
        (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
        pbVar7->_M_string_length = 0;
        (pbVar7->field_2)._M_local_buf[0] = '\0';
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_f8,"> requires member of an unknown struct <");
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar7->_M_dataplus)._M_p;
        paVar8 = &pbVar7->field_2;
        if (paVar9 == paVar8) {
          local_198.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_198.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
        }
        else {
          local_198.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_198._M_dataplus._M_p = (pointer)paVar9;
        }
        local_198._M_string_length = pbVar7->_M_string_length;
        (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
        pbVar7->_M_string_length = 0;
        (pbVar7->field_2)._M_local_buf[0] = '\0';
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_198,local_138._M_dataplus._M_p,local_138._M_string_length);
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar7->_M_dataplus)._M_p;
        paVar8 = &pbVar7->field_2;
        if (paVar9 == paVar8) {
          local_178.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_178.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
        }
        else {
          local_178.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_178._M_dataplus._M_p = (pointer)paVar9;
        }
        local_178._M_string_length = pbVar7->_M_string_length;
        (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
        pbVar7->_M_string_length = 0;
        (pbVar7->field_2)._M_local_buf[0] = '\0';
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_178,">");
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar7->_M_dataplus)._M_p;
        paVar8 = &pbVar7->field_2;
        if (paVar9 == paVar8) {
          local_158.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_158.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
        }
        else {
          local_158.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_158._M_dataplus._M_p = (pointer)paVar9;
        }
        local_158._M_string_length = pbVar7->_M_string_length;
        (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
        pbVar7->_M_string_length = 0;
        (pbVar7->field_2)._M_local_buf[0] = '\0';
        checkForError(cVar6._M_node != local_60,iVar4,&local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        sVar5 = local_d8._M_string_length;
        __s2._M_p = local_d8._M_dataplus._M_p;
        p_Var10 = cVar6._M_node[3]._M_right;
        p_Var2 = *(_Base_ptr *)(cVar6._M_node + 4);
        while ((p_Var10 != p_Var2 &&
               ((__n = p_Var10[4]._M_parent, __n != (_Base_ptr)sVar5 ||
                ((__n != (_Base_ptr)0x0 &&
                 (iVar4 = bcmp(*(void **)(p_Var10 + 4),__s2._M_p,(size_t)__n), iVar4 != 0))))))) {
          p_Var10 = (_Base_ptr)&p_Var10[0xc]._M_right;
        }
        iVar4 = require->xmlLine;
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        pcVar1 = (local_a8->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,pcVar1,pcVar1 + local_a8->_M_string_length);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_a0," <");
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_a0,(local_b0->_M_dataplus)._M_p,local_b0->_M_string_length);
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar7->_M_dataplus)._M_p;
        paVar8 = &pbVar7->field_2;
        if (paVar9 == paVar8) {
          local_80.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_80.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
        }
        else {
          local_80.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_80._M_dataplus._M_p = (pointer)paVar9;
        }
        local_80._M_string_length = pbVar7->_M_string_length;
        (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
        pbVar7->_M_string_length = 0;
        (pbVar7->field_2)._M_local_buf[0] = '\0';
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_80,"> requires unknown member <");
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar7->_M_dataplus)._M_p;
        paVar8 = &pbVar7->field_2;
        if (paVar9 == paVar8) {
          local_118.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_118.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
        }
        else {
          local_118.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_118._M_dataplus._M_p = (pointer)paVar9;
        }
        local_118._M_string_length = pbVar7->_M_string_length;
        (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
        pbVar7->_M_string_length = 0;
        (pbVar7->field_2)._M_local_buf[0] = '\0';
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_118,local_d8._M_dataplus._M_p,local_d8._M_string_length);
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar7->_M_dataplus)._M_p;
        paVar8 = &pbVar7->field_2;
        if (paVar9 == paVar8) {
          local_f8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
        }
        else {
          local_f8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_f8._M_dataplus._M_p = (pointer)paVar9;
        }
        local_f8._M_string_length = pbVar7->_M_string_length;
        (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
        pbVar7->_M_string_length = 0;
        (pbVar7->field_2)._M_local_buf[0] = '\0';
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_f8,"> as part of the struct <");
        local_198._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
        paVar9 = &pbVar7->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p == paVar9) {
          local_198.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_198.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        }
        else {
          local_198.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        }
        local_198._M_string_length = pbVar7->_M_string_length;
        (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar7->_M_string_length = 0;
        (pbVar7->field_2)._M_local_buf[0] = '\0';
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_198,local_138._M_dataplus._M_p,local_138._M_string_length);
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar7->_M_dataplus)._M_p;
        paVar8 = &pbVar7->field_2;
        if (paVar9 == paVar8) {
          local_178.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_178.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
        }
        else {
          local_178.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_178._M_dataplus._M_p = (pointer)paVar9;
        }
        local_178._M_string_length = pbVar7->_M_string_length;
        (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
        pbVar7->_M_string_length = 0;
        (pbVar7->field_2)._M_local_buf[0] = '\0';
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_178,">");
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar7->_M_dataplus)._M_p;
        paVar8 = &pbVar7->field_2;
        if (paVar9 == paVar8) {
          local_158.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_158.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
        }
        else {
          local_158.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_158._M_dataplus._M_p = (pointer)paVar9;
        }
        local_158._M_string_length = pbVar7->_M_string_length;
        (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
        pbVar7->_M_string_length = 0;
        (pbVar7->field_2)._M_local_buf[0] = '\0';
        checkForError(p_Var10 != p_Var2,iVar4,&local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
      }
      this_01 = this_01 + 1;
    } while (this_01 != local_50);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void VulkanHppGenerator::checkRequireDependenciesCorrectness( RequireData const & require, std::string const & section, std::string const & name ) const
{
  std::vector<std::string> dependencies = tokenizeAny( require.depends, ",+()" );
  for ( auto const & depends : dependencies )
  {
    size_t separatorPos = depends.find( "::" );
    if ( separatorPos == std::string::npos )
    {
      checkForError( isFeature( depends ) || isExtension( depends ),
                     require.xmlLine,
                     section + " <" + name + "> depends on unknown extension or feature <" + depends + ">" );
    }
    else
    {
      std::string structure = depends.substr( 0, separatorPos );
      std::string member    = depends.substr( separatorPos + 2 );
      auto        structIt  = m_structs.find( structure );
      checkForError( structIt != m_structs.end(), require.xmlLine, section + " <" + name + "> requires member of an unknown struct <" + structure + ">" );
      checkForError( std::ranges::find_if( structIt->second.members, [&member]( auto const & md ) { return md.name == member; } ) !=
                       structIt->second.members.end(),
                     require.xmlLine,
                     section + " <" + name + "> requires unknown member <" + member + "> as part of the struct <" + structure + ">" );
    }
  }
}